

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::Array2D<pbrt::SPPMPixel>::Array2D
          (Array2D<pbrt::SPPMPixel> *this,Bounds2i *extent,Allocator allocator)

{
  undefined8 *puVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  SPPMPixel *pSVar3;
  uint uVar4;
  long lVar5;
  polymorphic_allocator<std::byte> local_20;
  
  TVar2 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar2;
  (this->allocator).memoryResource = allocator.memoryResource;
  uVar4 = ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.y -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y) *
          ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.x -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x);
  local_20.memoryResource = allocator.memoryResource;
  pSVar3 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::SPPMPixel>
                     (&local_20,(long)(int)uVar4);
  this->values = pSVar3;
  for (lVar5 = 0; (ulong)(~((int)uVar4 >> 0x1f) & uVar4) * 0xa0 - lVar5 != 0; lVar5 = lVar5 + 0xa0)
  {
    pSVar3 = this->values;
    puVar1 = (undefined8 *)((long)(pSVar3->vp).beta.values.values + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1 = (undefined8 *)((long)(&(pSVar3->vp).beta + -2) + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1 = (undefined8 *)((long)(&(pSVar3->vp).beta + -6) + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    SPPMPixel::SPPMPixel((SPPMPixel *)((long)(&(pSVar3->vp).beta + -6) + lVar5));
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, Allocator allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }